

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.h
# Opt level: O0

void __thiscall
wallet::SQLiteCursor::SQLiteCursor
          (SQLiteCursor *this,vector<std::byte,_std::allocator<std::byte>_> *start_range,
          vector<std::byte,_std::allocator<std::byte>_> *end_range)

{
  long lVar1;
  vector<std::byte,_std::allocator<std::byte>_> *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DatabaseCursor::DatabaseCursor((DatabaseCursor *)in_RSI);
  *in_RDI = &PTR__SQLiteCursor_023ca358;
  in_RDI[1] = 0;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (in_RSI,(vector<std::byte,_std::allocator<std::byte>_> *)0x17b67e5);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (in_RSI,(vector<std::byte,_std::allocator<std::byte>_> *)0x17b67f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit SQLiteCursor(std::vector<std::byte> start_range, std::vector<std::byte> end_range)
        : m_prefix_range_start(std::move(start_range)),
        m_prefix_range_end(std::move(end_range))
    {}